

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gzungetc(int c,gzFile file)

{
  int iVar1;
  long local_30;
  uchar *dest;
  uchar *src;
  gz_statep state;
  gzFile file_local;
  int c_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = -1;
  }
  else if ((*file == 0x1c4f) && (*(int *)((long)file + 0x6c) == 0)) {
    if (*(int *)((long)file + 0x68) != 0) {
      *(undefined4 *)((long)file + 0x68) = 0;
      iVar1 = gz_skip((gz_statep)file,*(long *)((long)file + 0x60));
      if (iVar1 == -1) {
        return -1;
      }
    }
    if (c < 0) {
      file_local._4_4_ = -1;
    }
    else {
      file_local._4_4_ = c;
      if (*(int *)((long)file + 0x38) == 0) {
        *(undefined4 *)((long)file + 0x38) = 1;
        *(ulong *)((long)file + 0x30) =
             *(long *)((long)file + 0x28) + (ulong)(uint)(*(int *)((long)file + 0x18) << 1) + -1;
        **(undefined1 **)((long)file + 0x30) = (char)c;
        *(long *)((long)file + 0x10) = *(long *)((long)file + 0x10) + -1;
      }
      else if (*(int *)((long)file + 0x38) == *(int *)((long)file + 0x18) * 2) {
        gz_error((gz_statep)file,-5,"out of room to push characters");
        file_local._4_4_ = -1;
      }
      else {
        if (*(long *)((long)file + 0x30) == *(long *)((long)file + 0x28)) {
          local_30 = *(long *)((long)file + 0x28) + (ulong)(uint)(*(int *)((long)file + 0x18) << 1);
          dest = (uchar *)(*(long *)((long)file + 0x28) + (ulong)*(uint *)((long)file + 0x38));
          while (*(uchar **)((long)file + 0x28) < dest) {
            *(uchar *)(local_30 + -1) = dest[-1];
            local_30 = local_30 + -1;
            dest = dest + -1;
          }
          *(long *)((long)file + 0x30) = local_30;
        }
        *(int *)((long)file + 0x38) = *(int *)((long)file + 0x38) + 1;
        *(long *)((long)file + 0x30) = *(long *)((long)file + 0x30) + -1;
        **(undefined1 **)((long)file + 0x30) = (char)c;
        *(long *)((long)file + 0x10) = *(long *)((long)file + 0x10) + -1;
      }
    }
  }
  else {
    file_local._4_4_ = -1;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzungetc(int c, gzFile file)
{
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're reading and that there's no error */
    if (state->mode != GZ_READ || state->err != Z_OK)
        return -1;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return -1;
    }

    /* can't push EOF */
    if (c < 0)
        return -1;

    /* if output buffer empty, put byte at end (allows more pushing) */
    if (state->have == 0) {
        state->have = 1;
        state->next = state->out + (state->size << 1) - 1;
        state->next[0] = c;
        state->pos--;
        return c;
    }

    /* if no room, give up (must have already done a gzungetc()) */
    if (state->have == (state->size << 1)) {
        gz_error(state, Z_BUF_ERROR, "out of room to push characters");
        return -1;
    }

    /* slide output data if needed and insert byte before existing data */
    if (state->next == state->out) {
        unsigned char *src = state->out + state->have;
        unsigned char *dest = state->out + (state->size << 1);
        while (src > state->out)
            *--dest = *--src;
        state->next = dest;
    }
    state->have++;
    state->next--;
    state->next[0] = c;
    state->pos--;
    return c;
}